

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

GLFWglproc glfwGetProcAddress(char *procname)

{
  _GLFWwindow *p_Var1;
  _GLFWwindow *window;
  char *procname_local;
  
  if (procname != (char *)0x0) {
    if (_glfwInitialized == 0) {
      _glfwInputError(0x10001,(char *)0x0);
      procname_local = (char *)0x0;
    }
    else {
      p_Var1 = _glfwPlatformGetCurrentContext();
      if (p_Var1 == (_GLFWwindow *)0x0) {
        _glfwInputError(0x10002,(char *)0x0);
        procname_local = (char *)0x0;
      }
      else {
        procname_local = (char *)(*(p_Var1->context).getProcAddress)(procname);
      }
    }
    return (GLFWglproc)procname_local;
  }
  __assert_fail("procname != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/glfw/src/context.c"
                ,0x2c3,"GLFWglproc glfwGetProcAddress(const char *)");
}

Assistant:

GLFWAPI GLFWglproc glfwGetProcAddress(const char* procname)
{
    _GLFWwindow* window;
    assert(procname != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    window = _glfwPlatformGetCurrentContext();
    if (!window)
    {
        _glfwInputError(GLFW_NO_CURRENT_CONTEXT, NULL);
        return NULL;
    }

    return window->context.getProcAddress(procname);
}